

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qwidgetrepaintmanager.cpp
# Opt level: O0

void findAllTextureWidgetsRecursively(QWidget *tlw,QWidget *widget)

{
  long lVar1;
  bool bVar2;
  QWidgetPrivate *pQVar3;
  const_iterator o;
  QWidget *in_RSI;
  QWidgetPrivate *in_RDI;
  long in_FS_OFFSET;
  QWidget *ncw;
  add_const_t<QList<QWidget_*>_> *__range2;
  const_iterator __end2;
  const_iterator __begin2;
  __single_object tl;
  QList<QWidget_*> nativeChildren;
  value_type *in_stack_ffffffffffffff88;
  const_iterator local_30;
  QList<QWidget_*> *nativeChildren_00;
  QPlatformTextureList *widgetTextures;
  QWidget *pQVar4;
  QWidget *tlw_00;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  pQVar3 = QWidgetPrivate::get((QWidget *)0x3a9526);
  if ((*(uint *)&pQVar3->field_0x250 >> 0x19 & 1) != 0) {
    widgetTextures = (QPlatformTextureList *)&DAT_aaaaaaaaaaaaaaaa;
    pQVar4 = (QWidget *)&DAT_aaaaaaaaaaaaaaaa;
    tlw_00 = (QWidget *)&DAT_aaaaaaaaaaaaaaaa;
    QList<QWidget_*>::QList((QList<QWidget_*> *)0x3a9569);
    nativeChildren_00 = (QList<QWidget_*> *)&DAT_aaaaaaaaaaaaaaaa;
    std::make_unique<QPlatformTextureList>();
    std::unique_ptr<QPlatformTextureList,_std::default_delete<QPlatformTextureList>_>::get
              ((unique_ptr<QPlatformTextureList,_std::default_delete<QPlatformTextureList>_> *)
               0x3a959d);
    findTextureWidgetsRecursively(tlw_00,pQVar4,widgetTextures,nativeChildren_00);
    std::unique_ptr<QPlatformTextureList,_std::default_delete<QPlatformTextureList>_>::operator->
              ((unique_ptr<QPlatformTextureList,_std::default_delete<QPlatformTextureList>_> *)
               0x3a95be);
    bVar2 = QPlatformTextureList::isEmpty((QHash<QByteArray,_QFont> *)0x3a95c6);
    if (!bVar2) {
      QWidgetPrivate::get((QWidget *)0x3a95d4);
      QWidgetPrivate::topData(in_RDI);
      std::
      vector<std::unique_ptr<QPlatformTextureList,_std::default_delete<QPlatformTextureList>_>,_std::allocator<std::unique_ptr<QPlatformTextureList,_std::default_delete<QPlatformTextureList>_>_>_>
      ::push_back((vector<std::unique_ptr<QPlatformTextureList,_std::default_delete<QPlatformTextureList>_>,_std::allocator<std::unique_ptr<QPlatformTextureList,_std::default_delete<QPlatformTextureList>_>_>_>
                   *)in_RDI,in_stack_ffffffffffffff88);
    }
    pQVar4 = (QWidget *)&stack0xffffffffffffffe0;
    local_30.i = (QWidget **)&DAT_aaaaaaaaaaaaaaaa;
    local_30 = QList<QWidget_*>::begin((QList<QWidget_*> *)in_RDI);
    o = QList<QWidget_*>::end((QList<QWidget_*> *)in_RDI);
    while( true ) {
      bVar2 = QList<QWidget_*>::const_iterator::operator!=(&local_30,o);
      if (!bVar2) break;
      QList<QWidget_*>::const_iterator::operator*(&local_30);
      pQVar3 = QWidgetPrivate::get((QWidget *)0x3a967a);
      if ((*(uint *)&pQVar3->field_0x250 >> 0x19 & 1) != 0) {
        findAllTextureWidgetsRecursively(in_RSI,pQVar4);
      }
      QList<QWidget_*>::const_iterator::operator++(&local_30);
    }
    std::unique_ptr<QPlatformTextureList,_std::default_delete<QPlatformTextureList>_>::~unique_ptr
              ((unique_ptr<QPlatformTextureList,_std::default_delete<QPlatformTextureList>_> *)
               in_RDI);
    QList<QWidget_*>::~QList((QList<QWidget_*> *)0x3a96bc);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

static void findAllTextureWidgetsRecursively(QWidget *tlw, QWidget *widget)
{
    // textureChildSeen does not take native child widgets into account and that's good.
    if (QWidgetPrivate::get(widget)->textureChildSeen) {
        QList<QWidget *> nativeChildren;
        auto tl = std::make_unique<QPlatformTextureList>();
        // Look for texture widgets (incl. widget itself) from 'widget' down,
        // but skip subtrees with a parent of a native child widget.
        findTextureWidgetsRecursively(tlw, widget, tl.get(), &nativeChildren);
        // tl may be empty regardless of textureChildSeen if we have native or hidden children.
        if (!tl->isEmpty())
            QWidgetPrivate::get(tlw)->topData()->widgetTextures.push_back(std::move(tl));
        // Native child widgets, if there was any, get their own separate QPlatformTextureList.
        for (QWidget *ncw : std::as_const(nativeChildren)) {
            if (QWidgetPrivate::get(ncw)->textureChildSeen)
                findAllTextureWidgetsRecursively(tlw, ncw);
        }
    }
}